

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

Integer pnga_sprs_array_get_column(Integer s_a,Integer icol)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  Integer *mapc;
  void *__s;
  Integer IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _sparse_array *p_Var8;
  long lVar9;
  Integer IVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Integer IVar14;
  char cplus [2];
  Integer ihi;
  Integer ilo;
  Integer nprocs;
  void *vptr;
  void *ptr;
  Integer idim;
  Integer ld;
  char local_d2 [2];
  Integer local_d0;
  Integer local_c8;
  Integer local_c0;
  long local_b8;
  long local_b0;
  Integer local_a8;
  long local_a0;
  Integer local_98;
  long local_90;
  Integer local_88;
  Integer local_80;
  long local_78;
  long local_70;
  Integer *local_68;
  long local_60;
  Integer local_58;
  Integer local_50;
  void *local_48;
  Integer local_40;
  Integer local_38;
  
  lVar6 = s_a + 1000;
  lVar12 = lVar6 * 200;
  local_c0 = SPA[lVar6].type;
  local_40 = SPA[lVar6].idim;
  local_80 = icol;
  local_58 = s_a;
  local_88 = pnga_pgroup_nnodes(SPA[lVar6].grp);
  local_c8 = pnga_pgroup_nodeid(SPA[lVar6].grp);
  local_d2[0] = '+';
  local_d2[1] = '\0';
  local_a0 = (long)_ga_sync_begin;
  local_60 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (local_a0 != 0) {
    pnga_pgroup_sync(SPA[lVar6].grp);
  }
  IVar14 = local_88;
  p_Var8 = SPA;
  local_d0 = SPA[lVar6].ilo;
  local_98 = SPA[lVar6].ihi;
  sVar1 = local_88 * 8;
  __s = malloc(sVar1);
  local_68 = (Integer *)malloc(sVar1);
  local_a8 = IVar14;
  if (0 < IVar14) {
    memset(__s,0,sVar1);
  }
  *(Integer *)((long)__s + local_c8 * 8) = (local_98 - local_d0) + 1;
  pnga_pgroup_gop(p_Var8[lVar6].grp,0x3ea,__s,local_a8,local_d2);
  lVar11 = local_60;
  mapc = local_68;
  lVar5 = local_a0;
  *local_68 = 1;
  if (1 < local_88) {
    lVar7 = *local_68;
    lVar9 = 0;
    do {
      lVar7 = lVar7 + *(long *)((long)__s + lVar9 * 8);
      local_68[lVar9 + 1] = lVar7;
      lVar9 = lVar9 + 1;
    } while (local_88 + -1 != lVar9);
  }
  local_48 = __s;
  pnga_mask_sync(local_a0,local_60);
  IVar4 = pnga_create_handle();
  pnga_set_data(IVar4,1,&local_40,local_c0);
  pnga_set_pgroup(IVar4,SPA[lVar6].grp);
  pnga_set_irreg_distr(IVar4,mapc,&local_88);
  pnga_mask_sync(lVar5,lVar11);
  pnga_allocate(IVar4);
  pnga_mask_sync(lVar5,lVar11);
  pnga_zero(IVar4);
  IVar10 = local_98;
  IVar14 = local_d0;
  local_50 = IVar4;
  if (local_98 < local_d0) {
    local_70 = 0;
  }
  else {
    local_b0 = local_d0 + 1;
    local_b8 = local_98 + 1;
    pnga_access_ptr(IVar4,&local_b0,&local_b8,&local_70,&local_38);
  }
  lVar5 = (local_88 * local_80) / SPA[lVar6].jdim;
  if (0 < SPA[lVar6].nblocks) {
    p_Var8 = SPA + lVar6;
    lVar11 = 0;
    lVar6 = IVar14;
    local_a8 = lVar5;
    local_90 = lVar12;
    do {
      IVar14 = lVar6;
      if (p_Var8->blkidx[lVar11] == lVar5) {
        local_a0 = lVar11;
        if (p_Var8->idx_size == 4) {
          pnga_sprs_array_access_col_block(local_58,lVar5,&local_b0,&local_b8,&local_78);
          lVar9 = local_78;
          lVar7 = local_b8;
          lVar5 = local_a8;
          lVar11 = local_a0;
          lVar12 = local_90;
          if (lVar6 <= IVar10) {
            local_c8 = local_b0;
            lVar13 = lVar6;
            do {
              lVar13 = lVar6 - lVar13;
              iVar2 = *(int *)(local_c8 + lVar13 * 4);
              lVar12 = (long)iVar2;
              iVar3 = *(int *)(local_c8 + 4 + lVar13 * 4);
              local_c0 = lVar6;
              if (iVar2 < iVar3) {
                do {
                  if (*(int *)(lVar7 + lVar12 * 4) == local_80) {
                    sVar1 = *(size_t *)((long)&SPA->size + local_90);
                    memcpy((void *)(sVar1 * lVar13 + local_70),(void *)(sVar1 * lVar12 + lVar9),
                           sVar1);
                  }
                  lVar12 = lVar12 + 1;
                } while (iVar3 != lVar12);
              }
              lVar6 = local_c0 + 1;
              lVar5 = local_a8;
              IVar10 = local_98;
              lVar11 = local_a0;
              lVar12 = local_90;
              lVar13 = local_d0;
              IVar14 = local_d0;
            } while (local_c0 != local_98);
          }
        }
        else {
          pnga_sprs_array_access_col_block(local_58,lVar5,&local_b0,&local_b8,&local_78);
          lVar9 = local_78;
          lVar7 = local_b8;
          lVar5 = local_a8;
          lVar11 = local_a0;
          lVar12 = local_90;
          IVar14 = local_d0;
          if (lVar6 <= IVar10) {
            local_c8 = local_b0;
            lVar6 = local_d0;
            do {
              lVar11 = lVar6 - local_d0;
              lVar12 = *(long *)(local_c8 + lVar11 * 8);
              lVar5 = *(long *)(local_c8 + 8 + lVar11 * 8);
              local_c0 = lVar6;
              if (lVar12 < lVar5) {
                do {
                  if (*(long *)(lVar7 + lVar12 * 8) == local_80) {
                    sVar1 = *(size_t *)((long)&SPA->size + local_90);
                    memcpy((void *)(sVar1 * lVar11 + local_70),(void *)(sVar1 * lVar12 + lVar9),
                           sVar1);
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar5 != lVar12);
              }
              lVar6 = local_c0 + 1;
              lVar5 = local_a8;
              IVar10 = local_98;
              lVar11 = local_a0;
              lVar12 = local_90;
              IVar14 = local_d0;
            } while (local_c0 != local_98);
          }
        }
      }
      lVar11 = lVar11 + 1;
      p_Var8 = (_sparse_array *)((long)&SPA->idim + lVar12);
      lVar6 = IVar14;
    } while (lVar11 < *(long *)((long)&SPA->nblocks + lVar12));
  }
  IVar4 = local_50;
  local_b0 = IVar14 + 1;
  local_b8 = IVar10 + 1;
  pnga_release(local_50,&local_b0,&local_b8);
  free(local_68);
  free(local_48);
  if ((int)local_60 != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar12));
  }
  return IVar4;
}

Assistant:

Integer pnga_sprs_array_get_column(Integer s_a, Integer icol)
{
  Integer g_v;
  Integer handle = s_a + GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer type = SPA[handle].type;
  Integer one = 1;
  Integer idim = SPA[handle].idim;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer *size, *map;
  Integer i, j, n, hi, lo, ld;
  Integer iblock;
  void *ptr;
  char cplus[2];
  cplus[0] = '+';
  cplus[1] = '\0';

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* Create map array containing row offsets */
  hi = SPA[handle].ihi;
  lo = SPA[handle].ilo;
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = hi - lo + 1;
  if (sizeof(Integer) == sizeof(int)) {
    pnga_pgroup_gop(SPA[handle].grp,C_INT,size,nprocs,cplus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp,C_LONG,size,nprocs,cplus);
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) map[i] = map[i-1]+size[i-1];

  /* create column vector array and set it to zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_v = pnga_create_handle();
  pnga_set_data(g_v,one,&idim,type);
  pnga_set_pgroup(g_v,SPA[handle].grp);
  pnga_set_irreg_distr(g_v,map,&nprocs);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_allocate(g_v);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  if (hi >= lo) {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_access_ptr(g_v,&ilo,&ihi,&ptr,&ld);
  } else {
    ptr = NULL;
  }
  /* Find column block that contains value icol. Scan through all non-zero
   * in this block and if j-index corresponds to icol, then set corresponding
   * value in g_v
   */
  iblock = (icol*nprocs)/SPA[handle].jdim;
  for (n=0; n<SPA[handle].nblocks; n++) {
    if (SPA[handle].blkidx[n] == iblock) {
      if (SPA[handle].idx_size == sizeof(int)) {
        int *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      } else {
        int64_t *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      }
    }
  }
  {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_release(g_v,&ilo,&ihi);
  }
  free(map);
  free(size);
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_v;
}